

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::internal::DecodeMacCounters
                  (Error *__return_storage_ptr__,MacCounters *aMacCounters,ByteArray *aBuf)

{
  uint uVar1;
  uchar *puVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  string_view fmt;
  anon_class_1_0_00000001 local_12a;
  v10 local_129;
  v10 *local_128;
  size_t local_120;
  string local_118;
  Error local_f8;
  size_type local_d0;
  size_t length;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_c0;
  ByteArray *aBuf_local;
  MacCounters *aMacCounters_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  length._7_1_ = 0;
  local_c0 = aBuf;
  aBuf_local = (ByteArray *)aMacCounters;
  aMacCounters_local = (MacCounters *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  local_d0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_c0);
  if (local_d0 == 0x24) {
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_c0);
    uVar1 = utils::Decode<unsigned_int>(puVar2,4);
    *(uint *)&(aBuf_local->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
              _M_impl.super__Vector_impl_data._M_start = uVar1;
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_c0);
    uVar1 = utils::Decode<unsigned_int>(puVar2 + 4,4);
    *(uint *)((long)&(aBuf_local->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                     ._M_impl.super__Vector_impl_data._M_start + 4) = uVar1;
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_c0);
    uVar1 = utils::Decode<unsigned_int>(puVar2 + 8,4);
    *(uint *)&(aBuf_local->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
              _M_impl.super__Vector_impl_data._M_finish = uVar1;
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_c0);
    uVar1 = utils::Decode<unsigned_int>(puVar2 + 0xc,4);
    *(uint *)((long)&(aBuf_local->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                     ._M_impl.super__Vector_impl_data._M_finish + 4) = uVar1;
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_c0);
    uVar1 = utils::Decode<unsigned_int>(puVar2 + 0x10,4);
    *(uint *)&(aBuf_local->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = uVar1;
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_c0);
    uVar1 = utils::Decode<unsigned_int>(puVar2 + 0x14,4);
    *(uint *)((long)&(aBuf_local->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = uVar1;
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_c0);
    uVar1 = utils::Decode<unsigned_int>(puVar2 + 0x18,4);
    *(uint *)&aBuf_local[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = uVar1;
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_c0);
    uVar1 = utils::Decode<unsigned_int>(puVar2 + 0x1c,4);
    *(uint *)((long)&aBuf_local[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4) = uVar1;
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_c0);
    uVar1 = utils::Decode<unsigned_int>(puVar2 + 0x20,4);
    *(uint *)&aBuf_local[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = uVar1;
  }
  else {
    DecodeMacCounters::anon_class_1_0_00000001::operator()(&local_12a);
    local_58 = &local_128;
    local_60 = &local_129;
    bVar3 = ::fmt::v10::operator()(local_60);
    local_120 = bVar3.size_;
    local_128 = (v10 *)bVar3.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_118;
    local_78 = local_128;
    sStack_70 = local_120;
    local_50 = &local_78;
    local_88 = local_128;
    local_80 = local_120;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_20 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_118,local_88,fmt,args);
    Error::Error(&local_f8,kBadFormat,&local_118);
    Error::operator=(__return_storage_ptr__,&local_f8);
    Error::~Error(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
  }
  return __return_storage_ptr__;
}

Assistant:

Error internal::DecodeMacCounters(MacCounters &aMacCounters, const ByteArray &aBuf)
{
    Error  error;
    size_t length = aBuf.size();
    VerifyOrExit(length == kMacCountersBytes, error = ERROR_BAD_FORMAT("incorrect size of MacCounters"));
    aMacCounters.mIfInUnknownProtos  = utils::Decode<uint32_t>(aBuf.data(), 4);
    aMacCounters.mIfInErrors         = utils::Decode<uint32_t>(aBuf.data() + 4, 4);
    aMacCounters.mIfOutErrors        = utils::Decode<uint32_t>(aBuf.data() + 8, 4);
    aMacCounters.mIfInUcastPkts      = utils::Decode<uint32_t>(aBuf.data() + 12, 4);
    aMacCounters.mIfInBroadcastPkts  = utils::Decode<uint32_t>(aBuf.data() + 16, 4);
    aMacCounters.mIfInDiscards       = utils::Decode<uint32_t>(aBuf.data() + 20, 4);
    aMacCounters.mIfOutUcastPkts     = utils::Decode<uint32_t>(aBuf.data() + 24, 4);
    aMacCounters.mIfOutBroadcastPkts = utils::Decode<uint32_t>(aBuf.data() + 28, 4);
    aMacCounters.mIfOutDiscards      = utils::Decode<uint32_t>(aBuf.data() + 32, 4);

exit:
    return error;
}